

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall
QtMWidgets::MessageBox::addButton(MessageBox *this,QAbstractButton *button,ButtonRole role)

{
  MessageBoxPrivate *pMVar1;
  QAbstractButton *pQVar2;
  bool bVar3;
  QFrame *pQVar4;
  undefined4 *puVar5;
  ButtonRole role_local;
  QAbstractButton *button_local;
  QFrame *local_58;
  undefined8 local_50;
  QObject local_48 [8];
  code *local_40;
  ImplFn local_38;
  
  role_local = role;
  button_local = button;
  bVar3 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                    (&((this->d).d)->buttonsMap,&button_local);
  if (!bVar3) {
    pQVar4 = (QFrame *)operator_new(0x28);
    QFrame::QFrame(pQVar4,((this->d).d)->frame,0);
    QFrame::setFrameStyle((int)pQVar4);
    pMVar1 = (this->d).d;
    local_58 = pQVar4;
    QtPrivate::QPodArrayOps<QFrame*>::emplace<QFrame*&>
              ((QPodArrayOps<QFrame*> *)&pMVar1->buttonSeparators,(pMVar1->buttonSeparators).d.size,
               &local_58);
    pMVar1 = (this->d).d;
    QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::detach(&pMVar1->buttonsMap);
    std::
    map<QAbstractButton*,QtMWidgets::MessageBox::ButtonRole,std::less<QAbstractButton*>,std::allocator<std::pair<QAbstractButton*const,QtMWidgets::MessageBox::ButtonRole>>>
    ::insert_or_assign<QtMWidgets::MessageBox::ButtonRole_const&>
              ((map<QAbstractButton*,QtMWidgets::MessageBox::ButtonRole,std::less<QAbstractButton*>,std::allocator<std::pair<QAbstractButton*const,QtMWidgets::MessageBox::ButtonRole>>>
                *)&((pMVar1->buttonsMap).d.d)->m,&button_local,&role_local);
    pMVar1 = (this->d).d;
    local_58 = (QFrame *)button_local;
    QtPrivate::QPodArrayOps<QAbstractButton*>::emplace<QAbstractButton*&>
              ((QPodArrayOps<QAbstractButton*> *)&pMVar1->buttons,(pMVar1->buttons).d.size,
               (QAbstractButton **)&local_58);
    QBoxLayout::addWidget(((this->d).d)->hbox,pQVar4,0,0);
    QBoxLayout::addWidget(((this->d).d)->hbox,button_local,0,0);
    pQVar2 = button_local;
    local_58 = (QFrame *)QAbstractButton::clicked;
    local_50 = 0;
    local_40 = _q_clicked;
    local_38 = (ImplFn)0x0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QSlotObject<void_(QtMWidgets::MessageBox::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar5 + 4) = _q_clicked;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              (local_48,(void **)pQVar2,(QObject *)&local_58,(void **)this,
               (QSlotObjectBase *)&local_40,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    local_58 = (QFrame *)(**(code **)(*(long *)((this->d).d)->vbox + 0xf0))();
    QWidget::resize((QSize *)this);
    MessageBoxPrivate::adjustSize((this->d).d);
  }
  return;
}

Assistant:

void
MessageBox::addButton( QAbstractButton * button, ButtonRole role )
{
	if( !d->buttonsMap.contains( button ) )
	{
		QFrame * line = new QFrame( d->frame );
		line->setFrameStyle( QFrame::VLine | QFrame::Sunken );

		d->buttonSeparators.append( line );
		d->buttonsMap.insert( button, role );
		d->buttons.append( button );

		d->hbox->addWidget( line );
		d->hbox->addWidget( button );

		connect( button, &QAbstractButton::clicked,
			this, &MessageBox::_q_clicked );

		resize( d->vbox->sizeHint() );

		d->adjustSize();
	}
}